

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  long lVar31;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  uint *puVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  float fVar44;
  uint uVar45;
  float fVar63;
  uint uVar64;
  float fVar66;
  uint uVar67;
  float fVar68;
  uint uVar69;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar65;
  float fVar70;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar62;
  float fVar71;
  int iVar76;
  float fVar85;
  int iVar90;
  float fVar91;
  int iVar92;
  vint4 bi;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar94;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar95;
  float fVar96;
  uint uVar97;
  float fVar98;
  float fVar102;
  float fVar105;
  vint4 ai;
  uint uVar103;
  uint uVar106;
  float fVar107;
  uint uVar108;
  StackItemT<embree::NodeRefPtr<4>_> SVar99;
  float fVar104;
  float fVar109;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar118;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar119;
  float fVar123;
  float fVar124;
  undefined1 auVar120 [16];
  float fVar125;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar126;
  float fVar127;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar132;
  float fVar136;
  float fVar137;
  float fVar140;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar147;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [16];
  float fVar143;
  float fVar148;
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar165 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  int iVar181;
  float fVar182;
  int iVar183;
  float fVar184;
  undefined4 uVar185;
  int iVar186;
  float fVar187;
  undefined4 uVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  vbool<4> valid;
  float fStack_1304;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [8];
  undefined8 uStack_12b0;
  long local_12a8;
  float fStack_12a0;
  float fStack_129c;
  uint *local_1298;
  float fStack_1290;
  float fStack_128c;
  RTCFilterFunctionNArguments args;
  undefined8 local_1248;
  undefined8 uStack_1240;
  float fStack_1230;
  float fStack_122c;
  float fStack_1200;
  float fStack_11fc;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  float local_10e8 [4];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined1 local_1058 [16];
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar32;
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar75 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar109 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar118 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar169 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = uVar40 ^ 0x10;
  iVar26 = (tray->tnear).field_0.i[k];
  iVar95 = (tray->tfar).field_0.i[k];
  local_1018 = mm_lookupmask_ps._0_8_;
  uStack_1010 = mm_lookupmask_ps._8_8_;
  local_1028 = mm_lookupmask_ps._240_8_;
  uStack_1020 = mm_lookupmask_ps._248_8_;
  local_fa8 = fVar75;
  fStack_fa4 = fVar75;
  fStack_fa0 = fVar75;
  fStack_f9c = fVar75;
  local_fb8 = fVar109;
  fStack_fb4 = fVar109;
  fStack_fb0 = fVar109;
  fStack_fac = fVar109;
  local_fc8 = fVar118;
  fStack_fc4 = fVar118;
  fStack_fc0 = fVar118;
  fStack_fbc = fVar118;
  local_fd8 = fVar89;
  fStack_fd4 = fVar89;
  fStack_fd0 = fVar89;
  fStack_fcc = fVar89;
  local_fe8 = fVar98;
  fStack_fe4 = fVar98;
  fStack_fe0 = fVar98;
  fStack_fdc = fVar98;
  local_ff8 = fVar169;
  fStack_ff4 = fVar169;
  fStack_ff0 = fVar169;
  fStack_fec = fVar169;
  local_1008 = iVar26;
  iStack_1004 = iVar26;
  iStack_1000 = iVar26;
  iStack_ffc = iVar26;
  fVar87 = fVar169;
  fVar86 = fVar169;
  fVar161 = fVar169;
  fVar148 = fVar89;
  fVar88 = fVar89;
  fVar134 = fVar89;
  fVar177 = fVar75;
  fVar140 = fVar75;
  fVar170 = fVar75;
  iVar92 = iVar95;
  iVar90 = iVar95;
  iVar76 = iVar95;
  iVar186 = iVar26;
  iVar183 = iVar26;
  iVar181 = iVar26;
  fVar104 = fVar98;
  fVar73 = fVar98;
  fVar72 = fVar98;
  fVar158 = fVar118;
  fVar143 = fVar118;
  fVar74 = fVar118;
  fVar127 = fVar109;
  fVar172 = fVar109;
  fVar137 = fVar109;
LAB_0026d801:
  do {
    pSVar25 = pSVar29 + -1;
    pSVar29 = pSVar29 + -1;
    if ((float)pSVar25->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar25->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar37 = (pSVar29->ptr).ptr;
      while ((uVar37 & 8) == 0) {
        pfVar4 = (float *)(uVar37 + 0x20 + uVar40);
        fVar44 = (*pfVar4 - fVar170) * fVar134;
        fVar63 = (pfVar4[1] - fVar140) * fVar88;
        fVar66 = (pfVar4[2] - fVar177) * fVar148;
        fVar68 = (pfVar4[3] - fVar75) * fVar89;
        pfVar4 = (float *)(uVar37 + 0x20 + uVar38);
        fVar96 = (*pfVar4 - fVar137) * fVar72;
        fVar102 = (pfVar4[1] - fVar172) * fVar73;
        fVar105 = (pfVar4[2] - fVar127) * fVar104;
        fVar107 = (pfVar4[3] - fVar109) * fVar98;
        uVar97 = (uint)((int)fVar96 < (int)fVar44) * (int)fVar44 |
                 (uint)((int)fVar96 >= (int)fVar44) * (int)fVar96;
        uVar103 = (uint)((int)fVar102 < (int)fVar63) * (int)fVar63 |
                  (uint)((int)fVar102 >= (int)fVar63) * (int)fVar102;
        uVar106 = (uint)((int)fVar105 < (int)fVar66) * (int)fVar66 |
                  (uint)((int)fVar105 >= (int)fVar66) * (int)fVar105;
        uVar108 = (uint)((int)fVar107 < (int)fVar68) * (int)fVar68 |
                  (uint)((int)fVar107 >= (int)fVar68) * (int)fVar107;
        pfVar4 = (float *)(uVar37 + 0x20 + uVar43);
        fVar44 = (*pfVar4 - fVar74) * fVar161;
        fVar63 = (pfVar4[1] - fVar143) * fVar86;
        fVar66 = (pfVar4[2] - fVar158) * fVar87;
        fVar68 = (pfVar4[3] - fVar118) * fVar169;
        uVar45 = (uint)((int)fVar44 < iVar181) * iVar181 |
                 (uint)((int)fVar44 >= iVar181) * (int)fVar44;
        uVar64 = (uint)((int)fVar63 < iVar183) * iVar183 |
                 (uint)((int)fVar63 >= iVar183) * (int)fVar63;
        uVar67 = (uint)((int)fVar66 < iVar186) * iVar186 |
                 (uint)((int)fVar66 >= iVar186) * (int)fVar66;
        uVar69 = (uint)((int)fVar68 < iVar26) * iVar26 | (uint)((int)fVar68 >= iVar26) * (int)fVar68
        ;
        tNear.field_0.i[0] =
             ((int)uVar45 < (int)uVar97) * uVar97 | ((int)uVar45 >= (int)uVar97) * uVar45;
        tNear.field_0.i[1] =
             ((int)uVar64 < (int)uVar103) * uVar103 | ((int)uVar64 >= (int)uVar103) * uVar64;
        tNear.field_0.i[2] =
             ((int)uVar67 < (int)uVar106) * uVar106 | ((int)uVar67 >= (int)uVar106) * uVar67;
        tNear.field_0.i[3] =
             ((int)uVar69 < (int)uVar108) * uVar108 | ((int)uVar69 >= (int)uVar108) * uVar69;
        pfVar4 = (float *)(uVar37 + 0x20 + uVar33);
        fVar44 = (*pfVar4 - fVar170) * fVar134;
        fVar63 = (pfVar4[1] - fVar140) * fVar88;
        fVar66 = (pfVar4[2] - fVar177) * fVar148;
        fVar68 = (pfVar4[3] - fVar75) * fVar89;
        pfVar4 = (float *)(uVar37 + 0x20 + (uVar38 ^ 0x10));
        fVar96 = (*pfVar4 - fVar137) * fVar72;
        fVar102 = (pfVar4[1] - fVar172) * fVar73;
        fVar105 = (pfVar4[2] - fVar127) * fVar104;
        fVar107 = (pfVar4[3] - fVar109) * fVar98;
        uVar97 = (uint)((int)fVar44 < (int)fVar96) * (int)fVar44 |
                 (uint)((int)fVar44 >= (int)fVar96) * (int)fVar96;
        uVar103 = (uint)((int)fVar63 < (int)fVar102) * (int)fVar63 |
                  (uint)((int)fVar63 >= (int)fVar102) * (int)fVar102;
        uVar106 = (uint)((int)fVar66 < (int)fVar105) * (int)fVar66 |
                  (uint)((int)fVar66 >= (int)fVar105) * (int)fVar105;
        uVar108 = (uint)((int)fVar68 < (int)fVar107) * (int)fVar68 |
                  (uint)((int)fVar68 >= (int)fVar107) * (int)fVar107;
        pfVar4 = (float *)(uVar37 + 0x20 + (uVar43 ^ 0x10));
        fVar44 = (*pfVar4 - fVar74) * fVar161;
        fVar63 = (pfVar4[1] - fVar143) * fVar86;
        fVar66 = (pfVar4[2] - fVar158) * fVar87;
        fVar68 = (pfVar4[3] - fVar118) * fVar169;
        uVar45 = (uint)(iVar76 < (int)fVar44) * iVar76 | (uint)(iVar76 >= (int)fVar44) * (int)fVar44
        ;
        uVar64 = (uint)(iVar90 < (int)fVar63) * iVar90 | (uint)(iVar90 >= (int)fVar63) * (int)fVar63
        ;
        uVar67 = (uint)(iVar92 < (int)fVar66) * iVar92 | (uint)(iVar92 >= (int)fVar66) * (int)fVar66
        ;
        uVar69 = (uint)(iVar95 < (int)fVar68) * iVar95 | (uint)(iVar95 >= (int)fVar68) * (int)fVar68
        ;
        auVar146._0_4_ =
             -(uint)((int)(((int)uVar97 < (int)uVar45) * uVar97 |
                          ((int)uVar97 >= (int)uVar45) * uVar45) < tNear.field_0.i[0]);
        auVar146._4_4_ =
             -(uint)((int)(((int)uVar103 < (int)uVar64) * uVar103 |
                          ((int)uVar103 >= (int)uVar64) * uVar64) < tNear.field_0.i[1]);
        auVar146._8_4_ =
             -(uint)((int)(((int)uVar106 < (int)uVar67) * uVar106 |
                          ((int)uVar106 >= (int)uVar67) * uVar67) < tNear.field_0.i[2]);
        auVar146._12_4_ =
             -(uint)((int)(((int)uVar108 < (int)uVar69) * uVar108 |
                          ((int)uVar108 >= (int)uVar69) * uVar69) < tNear.field_0.i[3]);
        iVar36 = movmskps((int)uVar33,auVar146);
        if (iVar36 == 0xf) {
          if (pSVar29 == stack) {
            return;
          }
          goto LAB_0026d801;
        }
        bVar35 = (byte)iVar36 ^ 0xf;
        uVar34 = uVar37 & 0xfffffffffffffff0;
        lVar31 = 0;
        if (bVar35 != 0) {
          for (; (bVar35 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
          }
        }
        uVar37 = *(ulong *)(uVar34 + lVar31 * 8);
        uVar45 = bVar35 - 1 & (uint)bVar35;
        if (uVar45 != 0) {
          uVar64 = tNear.field_0.i[lVar31];
          lVar31 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar42 = *(ulong *)(uVar34 + lVar31 * 8);
          uVar67 = tNear.field_0.i[lVar31];
          uVar45 = uVar45 - 1 & uVar45;
          if (uVar45 == 0) {
            if (uVar64 < uVar67) {
              (pSVar29->ptr).ptr = uVar42;
              pSVar29->dist = uVar67;
              pSVar29 = pSVar29 + 1;
            }
            else {
              (pSVar29->ptr).ptr = uVar37;
              pSVar29->dist = uVar64;
              pSVar29 = pSVar29 + 1;
              uVar37 = uVar42;
            }
          }
          else {
            auVar175._8_4_ = uVar64;
            auVar175._0_8_ = uVar37;
            auVar175._12_4_ = 0;
            auVar130._8_4_ = uVar67;
            auVar130._0_8_ = uVar42;
            auVar130._12_4_ = 0;
            lVar31 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar5 = *(undefined8 *)(uVar34 + lVar31 * 8);
            iVar36 = tNear.field_0.i[lVar31];
            auVar139._8_4_ = iVar36;
            auVar139._0_8_ = uVar5;
            auVar139._12_4_ = 0;
            auVar131._8_4_ = -(uint)((int)uVar64 < (int)uVar67);
            uVar45 = uVar45 - 1 & uVar45;
            if (uVar45 == 0) {
              auVar131._4_4_ = auVar131._8_4_;
              auVar131._0_4_ = auVar131._8_4_;
              auVar131._12_4_ = auVar131._8_4_;
              auVar128._8_4_ = uVar67;
              auVar128._0_8_ = uVar42;
              auVar128._12_4_ = 0;
              auVar129 = blendvps(auVar128,auVar175,auVar131);
              auVar146 = blendvps(auVar175,auVar130,auVar131);
              auVar46._8_4_ = -(uint)(auVar129._8_4_ < iVar36);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar120._8_4_ = iVar36;
              auVar120._0_8_ = uVar5;
              auVar120._12_4_ = 0;
              auVar175 = blendvps(auVar120,auVar129,auVar46);
              auVar130 = blendvps(auVar129,auVar139,auVar46);
              auVar47._8_4_ = -(uint)(auVar146._8_4_ < auVar130._8_4_);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              SVar110 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar130,auVar146,auVar47);
              SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar130,auVar47);
              *pSVar29 = SVar99;
              pSVar29[1] = SVar110;
              uVar37 = auVar175._0_8_;
              pSVar29 = pSVar29 + 2;
            }
            else {
              lVar31 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              auVar129._4_4_ = auVar131._8_4_;
              auVar129._0_4_ = auVar131._8_4_;
              auVar129._8_4_ = auVar131._8_4_;
              auVar129._12_4_ = auVar131._8_4_;
              auVar131 = blendvps(auVar130,auVar175,auVar129);
              auVar146 = blendvps(auVar175,auVar130,auVar129);
              auVar138._8_4_ = tNear.field_0.i[lVar31];
              auVar138._0_8_ = *(undefined8 *)(uVar34 + lVar31 * 8);
              auVar138._12_4_ = 0;
              auVar48._8_4_ = -(uint)(iVar36 < tNear.field_0.i[lVar31]);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              auVar130 = blendvps(auVar138,auVar139,auVar48);
              auVar175 = blendvps(auVar139,auVar138,auVar48);
              auVar49._8_4_ = -(uint)(auVar146._8_4_ < auVar175._8_4_);
              auVar49._4_4_ = auVar49._8_4_;
              auVar49._0_4_ = auVar49._8_4_;
              auVar49._12_4_ = auVar49._8_4_;
              auVar139 = blendvps(auVar175,auVar146,auVar49);
              SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar175,auVar49);
              auVar50._8_4_ = -(uint)(auVar131._8_4_ < auVar130._8_4_);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              auVar146 = blendvps(auVar130,auVar131,auVar50);
              auVar175 = blendvps(auVar131,auVar130,auVar50);
              auVar51._8_4_ = -(uint)(auVar175._8_4_ < auVar139._8_4_);
              auVar51._4_4_ = auVar51._8_4_;
              auVar51._0_4_ = auVar51._8_4_;
              auVar51._12_4_ = auVar51._8_4_;
              SVar110 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar139,auVar175,auVar51);
              SVar132 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar175,auVar139,auVar51);
              *pSVar29 = SVar99;
              pSVar29[1] = SVar132;
              pSVar29[2] = SVar110;
              uVar37 = auVar146._0_8_;
              pSVar29 = pSVar29 + 3;
            }
          }
        }
      }
      uVar34 = (ulong)((uint)uVar37 & 0xf);
      if (uVar34 != 8) {
        lVar31 = 0;
        do {
          lVar30 = lVar31 * 0x60;
          pSVar6 = context->scene;
          puVar1 = (uint *)((uVar37 & 0xfffffffffffffff0) + lVar30);
          puVar39 = puVar1 + 0x10;
          ppfVar7 = (pSVar6->vertices).items;
          pfVar8 = ppfVar7[*puVar39];
          pfVar4 = pfVar8 + *puVar1;
          fVar98 = *pfVar4;
          fVar169 = pfVar4[1];
          fVar137 = pfVar4[2];
          pfVar4 = pfVar8 + puVar1[4];
          fVar172 = *pfVar4;
          fVar127 = pfVar4[2];
          pfVar2 = pfVar8 + puVar1[8];
          fVar74 = *pfVar2;
          fVar143 = pfVar2[1];
          fVar158 = pfVar2[2];
          pfVar8 = pfVar8 + puVar1[0xc];
          fVar72 = *pfVar8;
          fVar73 = pfVar8[2];
          pfVar9 = ppfVar7[puVar1[0x11]];
          pfVar2 = pfVar9 + puVar1[1];
          fVar104 = *pfVar2;
          fVar170 = pfVar2[1];
          fVar140 = pfVar2[2];
          pfVar2 = pfVar9 + puVar1[5];
          fVar177 = *pfVar2;
          fVar134 = pfVar2[2];
          pfVar3 = pfVar9 + puVar1[9];
          fVar88 = *pfVar3;
          fVar148 = pfVar3[1];
          fVar161 = pfVar3[2];
          pfVar9 = pfVar9 + puVar1[0xd];
          fVar86 = *pfVar9;
          fVar87 = pfVar9[2];
          pfVar10 = ppfVar7[puVar1[0x12]];
          pfVar3 = pfVar10 + puVar1[2];
          fVar44 = *pfVar3;
          fVar63 = pfVar3[1];
          fVar66 = pfVar3[2];
          fVar68 = pfVar10[(ulong)puVar1[6] + 2];
          uVar5 = *(undefined8 *)(pfVar10 + puVar1[10] + 2);
          uVar24 = *(undefined8 *)(pfVar10 + puVar1[0xe]);
          pfVar11 = ppfVar7[puVar1[0x13]];
          pfVar3 = pfVar11 + puVar1[3];
          fVar96 = *pfVar3;
          fVar102 = pfVar3[1];
          fVar105 = pfVar3[2];
          fVar107 = pfVar11[(ulong)puVar1[7] + 2];
          fVar151 = pfVar11[(ulong)puVar1[0xb] + 1];
          pfVar3 = pfVar11 + puVar1[0xf];
          fVar65 = *pfVar3;
          fVar70 = pfVar3[1];
          fVar94 = pfVar3[2];
          fStack_12f4 = (float)((ulong)*(undefined8 *)(pfVar10 + puVar1[10]) >> 0x20);
          local_1338 = (float)uVar24;
          fStack_1334 = (float)((ulong)uVar24 >> 0x20);
          fStack_1330 = (float)*(undefined8 *)(pfVar10 + puVar1[0xe] + 2);
          local_f88 = pfVar4[1];
          fStack_f84 = pfVar2[1];
          fStack_f80 = pfVar10[(ulong)puVar1[6] + 1];
          fStack_f7c = pfVar11[(ulong)puVar1[7] + 1];
          fVar126 = fVar169 - pfVar4[1];
          fVar133 = fVar170 - pfVar2[1];
          fVar135 = fVar63 - pfVar10[(ulong)puVar1[6] + 1];
          fVar136 = fVar102 - pfVar11[(ulong)puVar1[7] + 1];
          fVar152 = fVar137 - fVar127;
          fVar153 = fVar140 - fVar134;
          fVar154 = fVar66 - fVar68;
          fVar155 = fVar105 - fVar107;
          fVar171 = pfVar8[1] - fVar169;
          fVar176 = pfVar9[1] - fVar170;
          fVar178 = fStack_1334 - fVar63;
          fVar179 = fVar70 - fVar102;
          fVar180 = fVar73 - fVar137;
          fVar182 = fVar87 - fVar140;
          fVar184 = fStack_1330 - fVar66;
          fVar187 = fVar94 - fVar105;
          local_12b8._0_4_ = fVar152 * fVar171 - fVar126 * fVar180;
          local_12b8._4_4_ = fVar153 * fVar176 - fVar133 * fVar182;
          uStack_12b0._0_4_ = fVar154 * fVar178 - fVar135 * fVar184;
          uStack_12b0._4_4_ = fVar155 * fVar179 - fVar136 * fVar187;
          fVar164 = fVar72 - fVar98;
          fVar166 = fVar86 - fVar104;
          fVar167 = local_1338 - fVar44;
          fVar168 = fVar65 - fVar96;
          fVar75 = *(float *)(ray + k * 4);
          fStack_132c = *(float *)(ray + k * 4 + 0x10);
          fVar109 = *(float *)(ray + k * 4 + 0x40);
          fVar118 = *(float *)(ray + k * 4 + 0x50);
          fVar156 = fVar98 - fVar75;
          fVar159 = fVar104 - fVar75;
          fVar162 = fVar44 - fVar75;
          fVar163 = fVar96 - fVar75;
          fVar169 = fVar169 - fStack_132c;
          fVar170 = fVar170 - fStack_132c;
          fVar63 = fVar63 - fStack_132c;
          fVar102 = fVar102 - fStack_132c;
          fVar142 = fVar156 * fVar118 - fVar169 * fVar109;
          fVar147 = fVar159 * fVar118 - fVar170 * fVar109;
          fVar149 = fVar162 * fVar118 - fVar63 * fVar109;
          fVar150 = fVar163 * fVar118 - fVar102 * fVar109;
          fVar98 = fVar98 - fVar172;
          fVar104 = fVar104 - fVar177;
          fVar44 = fVar44 - fStack_1230;
          fVar96 = fVar96 - fStack_122c;
          local_f98 = fVar98 * fVar180 - fVar152 * fVar164;
          fStack_f94 = fVar104 * fVar182 - fVar153 * fVar166;
          fStack_f90 = fVar44 * fVar184 - fVar154 * fVar167;
          fStack_f8c = fVar96 * fVar187 - fVar155 * fVar168;
          fVar89 = *(float *)(ray + k * 4 + 0x20);
          fStack_1304 = *(float *)(ray + k * 4 + 0x60);
          fVar137 = fVar137 - fVar89;
          fVar140 = fVar140 - fVar89;
          fVar66 = fVar66 - fVar89;
          fVar105 = fVar105 - fVar89;
          fVar71 = fVar137 * fVar109 - fVar156 * fStack_1304;
          fVar85 = fVar140 * fVar109 - fVar159 * fStack_1304;
          fVar91 = fVar66 * fVar109 - fVar162 * fStack_1304;
          fVar93 = fVar105 * fVar109 - fVar163 * fStack_1304;
          fVar157 = fVar126 * fVar164 - fVar98 * fVar171;
          fVar160 = fVar133 * fVar166 - fVar104 * fVar176;
          uStack_1240._0_4_ = fVar135 * fVar167 - fVar44 * fVar178;
          uStack_1240._4_4_ = fVar136 * fVar168 - fVar96 * fVar179;
          fVar189 = fVar169 * fStack_1304 - fVar137 * fVar118;
          fVar190 = fVar170 * fStack_1304 - fVar140 * fVar118;
          fVar191 = fVar63 * fStack_1304 - fVar66 * fVar118;
          fVar192 = fVar102 * fStack_1304 - fVar105 * fVar118;
          local_1248 = CONCAT44(fVar160,fVar157);
          fVar119 = (float)local_12b8._0_4_ * fVar109 + local_f98 * fVar118 + fVar157 * fStack_1304;
          fVar123 = (float)local_12b8._4_4_ * fVar109 + fStack_f94 * fVar118 + fVar160 * fStack_1304
          ;
          fVar124 = (float)uStack_12b0 * fVar109 +
                    fStack_f90 * fVar118 + (float)uStack_1240 * fStack_1304;
          fVar125 = uStack_12b0._4_4_ * fVar109 +
                    fStack_f8c * fVar118 + uStack_1240._4_4_ * fStack_1304;
          uVar45 = (uint)fVar119 & 0x80000000;
          uVar64 = (uint)fVar123 & 0x80000000;
          uVar67 = (uint)fVar124 & 0x80000000;
          uVar69 = (uint)fVar125 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar164 * fVar189 + fVar171 * fVar71 + fVar180 * fVar142) ^ uVar45;
          tNear.field_0.i[1] =
               (uint)(fVar166 * fVar190 + fVar176 * fVar85 + fVar182 * fVar147) ^ uVar64;
          tNear.field_0.i[2] =
               (uint)(fVar167 * fVar191 + fVar178 * fVar91 + fVar184 * fVar149) ^ uVar67;
          tNear.field_0.i[3] =
               (uint)(fVar168 * fVar192 + fVar179 * fVar93 + fVar187 * fVar150) ^ uVar69;
          fVar71 = (float)((uint)(fVar189 * fVar98 + fVar71 * fVar126 + fVar142 * fVar152) ^ uVar45)
          ;
          fVar85 = (float)((uint)(fVar190 * fVar104 + fVar85 * fVar133 + fVar147 * fVar153) ^ uVar64
                          );
          fVar91 = (float)((uint)(fVar191 * fVar44 + fVar91 * fVar135 + fVar149 * fVar154) ^ uVar67)
          ;
          fVar93 = (float)((uint)(fVar192 * fVar96 + fVar93 * fVar136 + fVar150 * fVar155) ^ uVar69)
          ;
          fVar98 = ABS(fVar119);
          fVar104 = ABS(fVar123);
          fVar44 = ABS(fVar124);
          fVar96 = ABS(fVar125);
          bVar22 = ((0.0 <= tNear.field_0.v[0] && 0.0 <= fVar71) && fVar119 != 0.0) &&
                   tNear.field_0.v[0] + fVar71 <= fVar98;
          auVar144._0_4_ = -(uint)bVar22;
          bVar23 = ((0.0 <= tNear.field_0.v[1] && 0.0 <= fVar85) && fVar123 != 0.0) &&
                   tNear.field_0.v[1] + fVar85 <= fVar104;
          auVar144._4_4_ = -(uint)bVar23;
          bVar21 = ((0.0 <= tNear.field_0.v[2] && 0.0 <= fVar91) && fVar124 != 0.0) &&
                   tNear.field_0.v[2] + fVar91 <= fVar44;
          auVar144._8_4_ = -(uint)bVar21;
          bVar20 = ((0.0 <= tNear.field_0.v[3] && 0.0 <= fVar93) && fVar125 != 0.0) &&
                   tNear.field_0.v[3] + fVar93 <= fVar96;
          auVar144._12_4_ = -(uint)bVar20;
          lVar41 = (uVar37 & 0xfffffffffffffff0) + lVar30;
          iVar26 = movmskps((int)lVar30,auVar144);
          fStack_12a0 = fVar89;
          fStack_129c = fVar89;
          fStack_1290 = fVar75;
          fStack_128c = fVar75;
          if (iVar26 == 0) {
            uVar45 = 0;
          }
          else {
            fVar137 = (float)(uVar45 ^ (uint)(fVar156 * (float)local_12b8._0_4_ +
                                             fVar169 * local_f98 + fVar137 * fVar157));
            fVar170 = (float)(uVar64 ^ (uint)(fVar159 * (float)local_12b8._4_4_ +
                                             fVar170 * fStack_f94 + fVar140 * fVar160));
            fVar140 = (float)(uVar67 ^ (uint)(fVar162 * (float)uStack_12b0 +
                                             fVar63 * fStack_f90 + fVar66 * (float)uStack_1240));
            fVar63 = (float)(uVar69 ^ (uint)(fVar163 * uStack_12b0._4_4_ +
                                            fVar102 * fStack_f8c + fVar105 * uStack_1240._4_4_));
            fVar169 = *(float *)(ray + k * 4 + 0x30);
            bVar14 = fVar169 * fVar98 < fVar137;
            bVar15 = fVar169 * fVar104 < fVar170;
            bVar16 = fVar169 * fVar44 < fVar140;
            bVar17 = fVar169 * fVar96 < fVar63;
            auVar111._4_4_ = -(uint)bVar15;
            auVar111._0_4_ = -(uint)bVar14;
            auVar111._8_4_ = -(uint)bVar16;
            auVar111._12_4_ = -(uint)bVar17;
            fVar169 = *(float *)(ray + k * 4 + 0x80);
            uVar28 = 0;
            uVar185 = 0;
            uVar188 = 0;
            bVar22 = (fVar137 <= fVar169 * fVar98 && bVar14) && bVar22;
            bVar23 = (fVar170 <= fVar169 * fVar104 && bVar15) && bVar23;
            valid.field_0._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
            bVar21 = (fVar140 <= fVar169 * fVar44 && bVar16) && bVar21;
            valid.field_0.i[2] = -(uint)bVar21;
            bVar20 = (fVar63 <= fVar169 * fVar96 && bVar17) && bVar20;
            valid.field_0.i[3] = -(uint)bVar20;
            uVar45 = movmskps(iVar26,(undefined1  [16])valid.field_0);
            if (uVar45 != 0) {
              local_10c8._8_8_ = uStack_1010;
              local_10c8._0_8_ = local_1018;
              auVar19._4_4_ = fVar104;
              auVar19._0_4_ = fVar98;
              auVar19._8_4_ = fVar44;
              auVar19._12_4_ = fVar96;
              auVar146 = rcpps(auVar111,auVar19);
              fVar75 = auVar146._0_4_;
              fVar109 = auVar146._4_4_;
              fVar89 = auVar146._8_4_;
              fVar66 = auVar146._12_4_;
              fVar102 = (float)DAT_01f7ba10;
              fVar105 = DAT_01f7ba10._4_4_;
              fVar119 = DAT_01f7ba10._12_4_;
              fVar118 = DAT_01f7ba10._8_4_;
              fVar75 = (fVar102 - fVar98 * fVar75) * fVar75 + fVar75;
              fVar109 = (fVar105 - fVar104 * fVar109) * fVar109 + fVar109;
              fVar89 = (fVar118 - fVar44 * fVar89) * fVar89 + fVar89;
              fVar66 = (fVar119 - fVar96 * fVar66) * fVar66 + fVar66;
              auVar173._0_4_ = fVar137 * fVar75;
              auVar173._4_4_ = fVar170 * fVar109;
              auVar173._8_4_ = fVar140 * fVar89;
              auVar173._12_4_ = fVar63 * fVar66;
              local_1108 = auVar173;
              auVar165._0_4_ = tNear.field_0.v[0] * fVar75;
              auVar165._4_4_ = tNear.field_0.v[1] * fVar109;
              auVar165._8_4_ = tNear.field_0.v[2] * fVar89;
              auVar165._12_4_ = tNear.field_0.v[3] * fVar66;
              auVar175 = minps(auVar165,_DAT_01f7ba10);
              auVar100._0_4_ = fVar75 * fVar71;
              auVar100._4_4_ = fVar109 * fVar85;
              auVar100._8_4_ = fVar89 * fVar91;
              auVar100._12_4_ = fVar66 * fVar93;
              auVar146 = minps(auVar100,_DAT_01f7ba10);
              auVar112._0_4_ = fVar102 - auVar175._0_4_;
              auVar112._4_4_ = fVar105 - auVar175._4_4_;
              auVar112._8_4_ = fVar118 - auVar175._8_4_;
              auVar112._12_4_ = fVar119 - auVar175._12_4_;
              auVar121._0_4_ = fVar102 - auVar146._0_4_;
              auVar121._4_4_ = fVar105 - auVar146._4_4_;
              auVar121._8_4_ = fVar118 - auVar146._8_4_;
              auVar121._12_4_ = fVar119 - auVar146._12_4_;
              local_1128 = blendvps(auVar175,auVar112,local_10c8);
              local_1118 = blendvps(auVar146,auVar121,local_10c8);
              local_10f8._8_8_ = uStack_12b0;
              local_10f8._0_8_ = local_12b8;
              local_10e8[0] = local_f98;
              local_10e8[1] = fStack_f94;
              local_10e8[2] = fStack_f90;
              local_10e8[3] = fStack_f8c;
              local_10d8 = local_1248;
              uStack_10d0 = uStack_1240;
              auVar53._8_4_ = valid.field_0.i[2];
              auVar53._0_8_ = valid.field_0._0_8_;
              auVar53._12_4_ = valid.field_0.i[3];
              auVar175 = blendvps(_DAT_01f7a9f0,auVar173,auVar53);
              auVar113._4_4_ = auVar175._0_4_;
              auVar113._0_4_ = auVar175._4_4_;
              auVar113._8_4_ = auVar175._12_4_;
              auVar113._12_4_ = auVar175._8_4_;
              auVar146 = minps(auVar113,auVar175);
              auVar54._0_8_ = auVar146._8_8_;
              auVar54._8_4_ = auVar146._0_4_;
              auVar54._12_4_ = auVar146._4_4_;
              auVar146 = minps(auVar54,auVar146);
              auVar55._0_8_ =
                   CONCAT44(-(uint)(auVar146._4_4_ == auVar175._4_4_ && bVar23),
                            -(uint)(auVar146._0_4_ == auVar175._0_4_ && bVar22));
              auVar55._8_4_ = -(uint)(auVar146._8_4_ == auVar175._8_4_ && bVar21);
              auVar55._12_4_ = -(uint)(auVar146._12_4_ == auVar175._12_4_ && bVar20);
              iVar26 = movmskps(uVar45,auVar55);
              aVar77 = valid.field_0;
              if (iVar26 != 0) {
                aVar77.i[2] = auVar55._8_4_;
                aVar77._0_8_ = auVar55._0_8_;
                aVar77.i[3] = auVar55._12_4_;
              }
              uVar27 = movmskps(iVar26,(undefined1  [16])aVar77);
              uVar32 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar27);
              uVar42 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
LAB_0026e1f7:
              uVar45 = puVar39[uVar42];
              uVar32 = (ulong)uVar45;
              pGVar12 = (pSVar6->geometries).items[uVar32].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[uVar42] = 0.0;
LAB_0026e51d:
                uVar45 = movmskps((int)uVar32,(undefined1  [16])valid.field_0);
                if (uVar45 == 0) goto LAB_0026ec67;
                auVar175 = blendvps(_DAT_01f7a9f0,auVar173,(undefined1  [16])valid.field_0);
                auVar114._4_4_ = auVar175._0_4_;
                auVar114._0_4_ = auVar175._4_4_;
                auVar114._8_4_ = auVar175._12_4_;
                auVar114._12_4_ = auVar175._8_4_;
                auVar146 = minps(auVar114,auVar175);
                auVar79._0_8_ = auVar146._8_8_;
                auVar79._8_4_ = auVar146._0_4_;
                auVar79._12_4_ = auVar146._4_4_;
                auVar146 = minps(auVar79,auVar146);
                auVar80._0_8_ =
                     CONCAT44(-(uint)(auVar146._4_4_ == auVar175._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar146._0_4_ == auVar175._0_4_) & valid.field_0._0_4_);
                auVar80._8_4_ = -(uint)(auVar146._8_4_ == auVar175._8_4_) & valid.field_0._8_4_;
                auVar80._12_4_ = -(uint)(auVar146._12_4_ == auVar175._12_4_) & valid.field_0._12_4_;
                iVar26 = movmskps(uVar45,auVar80);
                aVar57 = valid.field_0;
                if (iVar26 != 0) {
                  aVar57.i[2] = auVar80._8_4_;
                  aVar57._0_8_ = auVar80._0_8_;
                  aVar57.i[3] = auVar80._12_4_;
                }
                uVar27 = movmskps(iVar26,(undefined1  [16])aVar57);
                uVar32 = CONCAT44((int)(uVar32 >> 0x20),uVar27);
                uVar42 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                goto LAB_0026e1f7;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_12b8._4_4_ = uVar28;
                local_12b8._0_4_ = fVar169;
                uStack_12b0._0_4_ = (float)uVar185;
                uStack_12b0._4_4_ = (float)uVar188;
                local_1088 = *(undefined4 *)(local_1128 + uVar42 * 4);
                local_1078 = *(undefined4 *)(local_1118 + uVar42 * 4);
                local_10b8._4_4_ = local_10e8[uVar42 - 4];
                local_10a8._4_4_ = local_10e8[uVar42];
                local_1058._4_4_ = uVar45;
                local_1058._0_4_ = uVar45;
                local_1058._8_4_ = uVar45;
                local_1058._12_4_ = uVar45;
                local_1068 = *(undefined4 *)(lVar41 + 0x50 + uVar42 * 4);
                local_1098._4_4_ = *(undefined4 *)((long)&local_10d8 + uVar42 * 4);
                local_10b8._0_4_ = local_10b8._4_4_;
                fStack_10b0 = (float)local_10b8._4_4_;
                fStack_10ac = (float)local_10b8._4_4_;
                local_10a8._0_4_ = local_10a8._4_4_;
                fStack_10a0 = (float)local_10a8._4_4_;
                fStack_109c = (float)local_10a8._4_4_;
                local_1098._0_4_ = local_1098._4_4_;
                local_1098._8_4_ = local_1098._4_4_;
                local_1098._12_4_ = local_1098._4_4_;
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1048 = context->user->instID[0];
                uStack_1044 = local_1048;
                uStack_1040 = local_1048;
                uStack_103c = local_1048;
                local_1038 = context->user->instPrimID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1108 + uVar42 * 4);
                local_12c8 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_12c8;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10b8;
                args.N = 4;
                local_12a8 = lVar41;
                local_1298 = puVar39;
                args.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->intersectionFilterN)(&args);
                }
                if (local_12c8 == (undefined1  [16])0x0) {
                  auVar78._8_4_ = 0xffffffff;
                  auVar78._0_8_ = 0xffffffffffffffff;
                  auVar78._12_4_ = 0xffffffff;
                  auVar78 = auVar78 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var13)(&args);
                  }
                  auVar56._0_4_ = -(uint)(local_12c8._0_4_ == 0);
                  auVar56._4_4_ = -(uint)(local_12c8._4_4_ == 0);
                  auVar56._8_4_ = -(uint)(local_12c8._8_4_ == 0);
                  auVar56._12_4_ = -(uint)(local_12c8._12_4_ == 0);
                  auVar78 = auVar56 ^ _DAT_01f7ae20;
                  if (local_12c8 != (undefined1  [16])0x0) {
                    auVar146 = blendvps(*(undefined1 (*) [16])args.hit,
                                        *(undefined1 (*) [16])(args.ray + 0xc0),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                        *(undefined1 (*) [16])(args.ray + 0xd0),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                        *(undefined1 (*) [16])(args.ray + 0xe0),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                        *(undefined1 (*) [16])(args.ray + 0xf0),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                        *(undefined1 (*) [16])(args.ray + 0x100),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                        *(undefined1 (*) [16])(args.ray + 0x110),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                        *(undefined1 (*) [16])(args.ray + 0x120),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                        *(undefined1 (*) [16])(args.ray + 0x130),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                        *(undefined1 (*) [16])(args.ray + 0x140),auVar56);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar146;
                  }
                }
                if ((_DAT_01f7bb20 & auVar78) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_12b8._0_4_;
                }
                else {
                  _local_12b8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[uVar42] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(auVar173._0_4_ <= (float)local_12b8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(auVar173._4_4_ <= (float)local_12b8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(auVar173._8_4_ <= (float)local_12b8._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(auVar173._12_4_ <= (float)local_12b8._0_4_) & valid.field_0.i[3];
                uVar32 = uVar42;
                puVar39 = local_1298;
                lVar41 = local_12a8;
                fVar169 = (float)local_12b8._0_4_;
                uVar28 = local_12b8._4_4_;
                uVar185 = (float)uStack_12b0;
                uVar188 = uStack_12b0._4_4_;
                goto LAB_0026e51d;
              }
              uVar28 = *(undefined4 *)(local_1128 + uVar42 * 4);
              uVar185 = *(undefined4 *)(local_1118 + uVar42 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1108 + uVar42 * 4);
              *(float *)(ray + k * 4 + 0xc0) = local_10e8[uVar42 - 4];
              *(float *)(ray + k * 4 + 0xd0) = local_10e8[uVar42];
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10d8 + uVar42 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar185;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar41 + 0x50 + uVar42 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar45;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar45 = context->user->instPrimID[0];
              *(uint *)(ray + k * 4 + 0x140) = uVar45;
LAB_0026ec67:
              fVar75 = *(float *)(ray + k * 4);
              fStack_132c = *(float *)(ray + k * 4 + 0x10);
              fVar89 = *(float *)(ray + k * 4 + 0x20);
              fVar109 = *(float *)(ray + k * 4 + 0x40);
              fVar118 = *(float *)(ray + k * 4 + 0x50);
              fStack_1304 = *(float *)(ray + k * 4 + 0x60);
            }
          }
          fVar72 = fVar74 - fVar72;
          fVar86 = fVar88 - fVar86;
          fStack_1200 = fStack_12e0 - fStack_1200;
          fStack_11fc = fStack_12dc - fStack_11fc;
          local_1338 = fVar143 - local_1338;
          fVar65 = fVar148 - fVar65;
          fStack_1334 = fStack_12f4 - fStack_1334;
          fVar70 = fVar151 - fVar70;
          fStack_12f0 = (float)uVar5;
          fStack_12ec = (float)((ulong)uVar5 >> 0x20);
          fVar73 = fVar158 - fVar73;
          fVar87 = fVar161 - fVar87;
          fStack_1330 = fStack_12f0 - fStack_1330;
          fVar94 = fStack_12ec - fVar94;
          fVar172 = fVar172 - fVar74;
          fVar177 = fVar177 - fVar88;
          fVar123 = fStack_1230 - fStack_12e0;
          fVar124 = fStack_122c - fStack_12dc;
          fVar96 = local_f88 - fVar143;
          fVar102 = fStack_f84 - fVar148;
          fVar105 = fStack_f80 - fStack_12f4;
          fVar71 = fStack_f7c - fVar151;
          fVar127 = fVar127 - fVar158;
          fVar134 = fVar134 - fVar161;
          fVar68 = fVar68 - fStack_12f0;
          fVar107 = fVar107 - fStack_12ec;
          local_10f8._0_4_ = fVar96 * fVar73 - fVar127 * local_1338;
          local_10f8._4_4_ = fVar102 * fVar87 - fVar134 * fVar65;
          local_10f8._8_4_ = fVar105 * fStack_1330 - fVar68 * fStack_1334;
          local_10f8._12_4_ = fVar71 * fVar94 - fVar107 * fVar70;
          local_10e8[0] = fVar127 * fVar72 - fVar172 * fVar73;
          local_10e8[1] = fVar134 * fVar86 - fVar177 * fVar87;
          local_10e8[2] = fVar68 * fStack_1200 - fVar123 * fStack_1330;
          local_10e8[3] = fVar107 * fStack_11fc - fVar124 * fVar94;
          fVar125 = fVar172 * local_1338 - fVar96 * fVar72;
          fVar126 = fVar177 * fVar65 - fVar102 * fVar86;
          fVar133 = fVar123 * fStack_1334 - fVar105 * fStack_1200;
          fVar135 = fVar124 * fVar70 - fVar71 * fStack_11fc;
          fVar74 = fVar74 - fVar75;
          fVar88 = fVar88 - fVar75;
          fStack_12e0 = fStack_12e0 - fVar75;
          fStack_12dc = fStack_12dc - fVar75;
          fVar143 = fVar143 - fStack_132c;
          fVar148 = fVar148 - fStack_132c;
          fStack_12f4 = fStack_12f4 - fStack_132c;
          fVar151 = fVar151 - fStack_132c;
          fVar158 = fVar158 - fVar89;
          fVar161 = fVar161 - fVar89;
          fStack_12f0 = fStack_12f0 - fVar89;
          fStack_12ec = fStack_12ec - fVar89;
          fVar140 = fVar143 * fStack_1304 - fVar158 * fVar118;
          fVar44 = fVar148 * fStack_1304 - fVar161 * fVar118;
          fVar63 = fStack_12f4 * fStack_1304 - fStack_12f0 * fVar118;
          fVar66 = fVar151 * fStack_1304 - fStack_12ec * fVar118;
          fVar85 = fVar158 * fVar109 - fVar74 * fStack_1304;
          fVar91 = fVar161 * fVar109 - fVar88 * fStack_1304;
          fVar93 = fStack_12f0 * fVar109 - fStack_12e0 * fStack_1304;
          fVar119 = fStack_12ec * fVar109 - fStack_12dc * fStack_1304;
          fVar75 = fVar74 * fVar118 - fVar143 * fVar109;
          fVar89 = fVar88 * fVar118 - fVar148 * fVar109;
          fVar98 = fStack_12e0 * fVar118 - fStack_12f4 * fVar109;
          fVar169 = fStack_12dc * fVar118 - fVar151 * fVar109;
          fVar137 = fVar109 * local_10f8._0_4_ + fVar118 * local_10e8[0] + fStack_1304 * fVar125;
          fVar104 = fVar109 * local_10f8._4_4_ + fVar118 * local_10e8[1] + fStack_1304 * fVar126;
          fVar170 = fVar109 * local_10f8._8_4_ + fVar118 * local_10e8[2] + fStack_1304 * fVar133;
          fVar109 = fVar109 * local_10f8._12_4_ + fVar118 * local_10e8[3] + fStack_1304 * fVar135;
          uVar64 = (uint)fVar137 & 0x80000000;
          uVar67 = (uint)fVar104 & 0x80000000;
          uVar69 = (uint)fVar170 & 0x80000000;
          uVar97 = (uint)fVar109 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar172 * fVar140 + fVar96 * fVar85 + fVar127 * fVar75) ^ uVar64;
          tNear.field_0.i[1] =
               (uint)(fVar177 * fVar44 + fVar102 * fVar91 + fVar134 * fVar89) ^ uVar67;
          tNear.field_0.i[2] =
               (uint)(fVar123 * fVar63 + fVar105 * fVar93 + fVar68 * fVar98) ^ uVar69;
          tNear.field_0.i[3] =
               (uint)(fVar124 * fVar66 + fVar71 * fVar119 + fVar107 * fVar169) ^ uVar97;
          fVar75 = (float)((uint)(fVar140 * fVar72 + fVar85 * local_1338 + fVar75 * fVar73) ^ uVar64
                          );
          fVar118 = (float)((uint)(fVar44 * fVar86 + fVar91 * fVar65 + fVar89 * fVar87) ^ uVar67);
          fVar89 = (float)((uint)(fVar63 * fStack_1200 + fVar93 * fStack_1334 + fVar98 * fStack_1330
                                 ) ^ uVar69);
          fVar98 = (float)((uint)(fVar66 * fStack_11fc + fVar119 * fVar70 + fVar169 * fVar94) ^
                          uVar97);
          fVar169 = ABS(fVar137);
          fVar172 = ABS(fVar104);
          fVar127 = ABS(fVar170);
          fVar72 = ABS(fVar109);
          bVar22 = tNear.field_0.v[0] + fVar75 <= fVar169 &&
                   ((0.0 <= fVar75 && 0.0 <= tNear.field_0.v[0]) && fVar137 != 0.0);
          auVar52._0_4_ = -(uint)bVar22;
          bVar23 = tNear.field_0.v[1] + fVar118 <= fVar172 &&
                   ((0.0 <= fVar118 && 0.0 <= tNear.field_0.v[1]) && fVar104 != 0.0);
          auVar52._4_4_ = -(uint)bVar23;
          bVar21 = tNear.field_0.v[2] + fVar89 <= fVar127 &&
                   ((0.0 <= fVar89 && 0.0 <= tNear.field_0.v[2]) && fVar170 != 0.0);
          auVar52._8_4_ = -(uint)bVar21;
          bVar20 = tNear.field_0.v[3] + fVar98 <= fVar72 &&
                   ((0.0 <= fVar98 && 0.0 <= tNear.field_0.v[3]) && fVar109 != 0.0);
          auVar52._12_4_ = -(uint)bVar20;
          iVar26 = movmskps(uVar45,auVar52);
          if (iVar26 != 0) {
            fVar74 = (float)(uVar64 ^ (uint)(fVar74 * local_10f8._0_4_ +
                                            fVar143 * local_10e8[0] + fVar158 * fVar125));
            fVar143 = (float)(uVar67 ^ (uint)(fVar88 * local_10f8._4_4_ +
                                             fVar148 * local_10e8[1] + fVar161 * fVar126));
            fVar158 = (float)(uVar69 ^ (uint)(fStack_12e0 * local_10f8._8_4_ +
                                             fStack_12f4 * local_10e8[2] + fStack_12f0 * fVar133));
            fVar73 = (float)(uVar97 ^ (uint)(fStack_12dc * local_10f8._12_4_ +
                                            fVar151 * local_10e8[3] + fStack_12ec * fVar135));
            fVar109 = *(float *)(ray + k * 4 + 0x30);
            fVar137 = *(float *)(ray + k * 4 + 0x80);
            auVar145._0_4_ = fVar137 * fVar169;
            auVar145._4_4_ = fVar137 * fVar172;
            auVar145._8_4_ = fVar137 * fVar127;
            auVar145._12_4_ = fVar137 * fVar72;
            bVar22 = (fVar74 <= auVar145._0_4_ && fVar109 * fVar169 < fVar74) && bVar22;
            bVar23 = (fVar143 <= auVar145._4_4_ && fVar109 * fVar172 < fVar143) && bVar23;
            valid.field_0._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
            bVar21 = (fVar158 <= auVar145._8_4_ && fVar109 * fVar127 < fVar158) && bVar21;
            valid.field_0.i[2] = -(uint)bVar21;
            bVar20 = (fVar73 <= auVar145._12_4_ && fVar109 * fVar72 < fVar73) && bVar20;
            valid.field_0.i[3] = -(uint)bVar20;
            iVar26 = movmskps(iVar26,(undefined1  [16])valid.field_0);
            if (iVar26 != 0) {
              local_10c8._8_8_ = uStack_1020;
              local_10c8._0_8_ = local_1028;
              pSVar6 = context->scene;
              auVar18._4_4_ = fVar172;
              auVar18._0_4_ = fVar169;
              auVar18._8_4_ = fVar127;
              auVar18._12_4_ = fVar72;
              auVar146 = rcpps(auVar145,auVar18);
              fVar109 = auVar146._0_4_;
              fVar104 = auVar146._4_4_;
              fVar140 = auVar146._8_4_;
              fVar177 = auVar146._12_4_;
              fVar134 = (float)DAT_01f7ba10;
              fVar88 = DAT_01f7ba10._4_4_;
              fVar148 = DAT_01f7ba10._12_4_;
              fVar170 = DAT_01f7ba10._8_4_;
              fVar109 = (fVar134 - fVar169 * fVar109) * fVar109 + fVar109;
              fVar104 = (fVar88 - fVar172 * fVar104) * fVar104 + fVar104;
              fVar140 = (fVar170 - fVar127 * fVar140) * fVar140 + fVar140;
              fVar177 = (fVar148 - fVar72 * fVar177) * fVar177 + fVar177;
              auVar141._0_4_ = fVar74 * fVar109;
              auVar141._4_4_ = fVar143 * fVar104;
              auVar141._8_4_ = fVar158 * fVar140;
              auVar141._12_4_ = fVar73 * fVar177;
              local_1108 = auVar141;
              auVar174._0_4_ = tNear.field_0.v[0] * fVar109;
              auVar174._4_4_ = tNear.field_0.v[1] * fVar104;
              auVar174._8_4_ = tNear.field_0.v[2] * fVar140;
              auVar174._12_4_ = tNear.field_0.v[3] * fVar177;
              auVar175 = minps(auVar174,_DAT_01f7ba10);
              auVar122._0_4_ = fVar109 * fVar75;
              auVar122._4_4_ = fVar104 * fVar118;
              auVar122._8_4_ = fVar140 * fVar89;
              auVar122._12_4_ = fVar177 * fVar98;
              auVar146 = minps(auVar122,_DAT_01f7ba10);
              auVar101._0_4_ = fVar134 - auVar175._0_4_;
              auVar101._4_4_ = fVar88 - auVar175._4_4_;
              auVar101._8_4_ = fVar170 - auVar175._8_4_;
              auVar101._12_4_ = fVar148 - auVar175._12_4_;
              auVar115._0_4_ = fVar134 - auVar146._0_4_;
              auVar115._4_4_ = fVar88 - auVar146._4_4_;
              auVar115._8_4_ = fVar170 - auVar146._8_4_;
              auVar115._12_4_ = fVar148 - auVar146._12_4_;
              local_1128 = blendvps(auVar175,auVar101,local_10c8);
              local_1118 = blendvps(auVar146,auVar115,local_10c8);
              local_10d8 = CONCAT44(fVar126,fVar125);
              uStack_10d0 = CONCAT44(fVar135,fVar133);
              auVar58._8_4_ = valid.field_0.i[2];
              auVar58._0_8_ = valid.field_0._0_8_;
              auVar58._12_4_ = valid.field_0.i[3];
              auVar175 = blendvps(_DAT_01f7a9f0,auVar141,auVar58);
              auVar116._4_4_ = auVar175._0_4_;
              auVar116._0_4_ = auVar175._4_4_;
              auVar116._8_4_ = auVar175._12_4_;
              auVar116._12_4_ = auVar175._8_4_;
              auVar146 = minps(auVar116,auVar175);
              auVar59._0_8_ = auVar146._8_8_;
              auVar59._8_4_ = auVar146._0_4_;
              auVar59._12_4_ = auVar146._4_4_;
              auVar146 = minps(auVar59,auVar146);
              auVar60._0_8_ =
                   CONCAT44(-(uint)(auVar146._4_4_ == auVar175._4_4_ && bVar23),
                            -(uint)(auVar146._0_4_ == auVar175._0_4_ && bVar22));
              auVar60._8_4_ = -(uint)(auVar146._8_4_ == auVar175._8_4_ && bVar21);
              auVar60._12_4_ = -(uint)(auVar146._12_4_ == auVar175._12_4_ && bVar20);
              iVar26 = movmskps((int)context,auVar60);
              aVar81 = valid.field_0;
              if (iVar26 != 0) {
                aVar81.i[2] = auVar60._8_4_;
                aVar81._0_8_ = auVar60._0_8_;
                aVar81.i[3] = auVar60._12_4_;
              }
              uVar28 = movmskps(iVar26,(undefined1  [16])aVar81);
              uVar32 = CONCAT44((int)((ulong)context >> 0x20),uVar28);
              uVar42 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
LAB_0026e7a9:
              uVar45 = puVar39[uVar42];
              uVar32 = (ulong)uVar45;
              pGVar12 = (pSVar6->geometries).items[uVar32].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[uVar42] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar28 = *(undefined4 *)(local_1128 + uVar42 * 4);
                  uVar185 = *(undefined4 *)(local_1118 + uVar42 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1108 + uVar42 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = local_10e8[uVar42 - 4];
                  *(float *)(ray + k * 4 + 0xd0) = local_10e8[uVar42];
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&local_10d8 + uVar42 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar185;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar41 + 0x50 + uVar42 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar45;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0026e00f;
                }
                local_1088 = *(undefined4 *)(local_1128 + uVar42 * 4);
                local_1078 = *(undefined4 *)(local_1118 + uVar42 * 4);
                fVar75 = local_10e8[uVar42 - 4];
                fVar109 = local_10e8[uVar42];
                local_1058._4_4_ = uVar45;
                local_1058._0_4_ = uVar45;
                local_1058._8_4_ = uVar45;
                local_1058._12_4_ = uVar45;
                local_1068 = *(undefined4 *)(lVar41 + 0x50 + uVar42 * 4);
                local_10b8._4_4_ = fVar75;
                local_10b8._0_4_ = fVar75;
                fStack_10b0 = fVar75;
                fStack_10ac = fVar75;
                local_10a8._4_4_ = fVar109;
                local_10a8._0_4_ = fVar109;
                fStack_10a0 = fVar109;
                fStack_109c = fVar109;
                uVar28 = *(undefined4 *)((long)&local_10d8 + uVar42 * 4);
                local_1098._4_4_ = uVar28;
                local_1098._0_4_ = uVar28;
                local_1098._8_4_ = uVar28;
                local_1098._12_4_ = uVar28;
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1048 = context->user->instID[0];
                uStack_1044 = local_1048;
                uStack_1040 = local_1048;
                uStack_103c = local_1048;
                local_1038 = context->user->instPrimID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1108 + uVar42 * 4);
                local_12c8 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_12c8;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10b8;
                args.N = 4;
                local_12a8 = lVar41;
                local_1298 = puVar39;
                args.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->intersectionFilterN)(&args);
                }
                if (local_12c8 == (undefined1  [16])0x0) {
                  auVar82._8_4_ = 0xffffffff;
                  auVar82._0_8_ = 0xffffffffffffffff;
                  auVar82._12_4_ = 0xffffffff;
                  auVar82 = auVar82 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var13)(&args);
                  }
                  auVar61._0_4_ = -(uint)(local_12c8._0_4_ == 0);
                  auVar61._4_4_ = -(uint)(local_12c8._4_4_ == 0);
                  auVar61._8_4_ = -(uint)(local_12c8._8_4_ == 0);
                  auVar61._12_4_ = -(uint)(local_12c8._12_4_ == 0);
                  auVar82 = auVar61 ^ _DAT_01f7ae20;
                  if (local_12c8 != (undefined1  [16])0x0) {
                    auVar146 = blendvps(*(undefined1 (*) [16])args.hit,
                                        *(undefined1 (*) [16])(args.ray + 0xc0),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                        *(undefined1 (*) [16])(args.ray + 0xd0),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                        *(undefined1 (*) [16])(args.ray + 0xe0),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                        *(undefined1 (*) [16])(args.ray + 0xf0),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                        *(undefined1 (*) [16])(args.ray + 0x100),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                        *(undefined1 (*) [16])(args.ray + 0x110),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                        *(undefined1 (*) [16])(args.ray + 0x120),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                        *(undefined1 (*) [16])(args.ray + 0x130),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar146;
                    auVar146 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                        *(undefined1 (*) [16])(args.ray + 0x140),auVar61);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar146;
                  }
                }
                if ((_DAT_01f7bb20 & auVar82) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar137;
                }
                else {
                  fVar137 = *(float *)(ray + k * 4 + 0x80);
                }
                valid.field_0.v[uVar42] = 0.0;
                valid.field_0.i[0] = -(uint)(auVar141._0_4_ <= fVar137) & valid.field_0.i[0];
                valid.field_0.i[1] = -(uint)(auVar141._4_4_ <= fVar137) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(auVar141._8_4_ <= fVar137) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar141._12_4_ <= fVar137) & valid.field_0.i[3];
                uVar32 = uVar42;
                puVar39 = local_1298;
                lVar41 = local_12a8;
              }
              iVar26 = movmskps((int)uVar32,(undefined1  [16])valid.field_0);
              if (iVar26 == 0) goto LAB_0026e00f;
              auVar175 = blendvps(_DAT_01f7a9f0,auVar141,(undefined1  [16])valid.field_0);
              auVar117._4_4_ = auVar175._0_4_;
              auVar117._0_4_ = auVar175._4_4_;
              auVar117._8_4_ = auVar175._12_4_;
              auVar117._12_4_ = auVar175._8_4_;
              auVar146 = minps(auVar117,auVar175);
              auVar83._0_8_ = auVar146._8_8_;
              auVar83._8_4_ = auVar146._0_4_;
              auVar83._12_4_ = auVar146._4_4_;
              auVar146 = minps(auVar83,auVar146);
              auVar84._0_8_ =
                   CONCAT44(-(uint)(auVar146._4_4_ == auVar175._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar146._0_4_ == auVar175._0_4_) & valid.field_0._0_4_);
              auVar84._8_4_ = -(uint)(auVar146._8_4_ == auVar175._8_4_) & valid.field_0._8_4_;
              auVar84._12_4_ = -(uint)(auVar146._12_4_ == auVar175._12_4_) & valid.field_0._12_4_;
              iVar26 = movmskps(iVar26,auVar84);
              aVar62 = valid.field_0;
              if (iVar26 != 0) {
                aVar62.i[2] = auVar84._8_4_;
                aVar62._0_8_ = auVar84._0_8_;
                aVar62.i[3] = auVar84._12_4_;
              }
              uVar28 = movmskps(iVar26,(undefined1  [16])aVar62);
              uVar32 = CONCAT44((int)(uVar32 >> 0x20),uVar28);
              uVar42 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              goto LAB_0026e7a9;
            }
          }
LAB_0026e00f:
          lVar31 = lVar31 + 1;
        } while (lVar31 != uVar34 - 8);
      }
      iVar76 = *(int *)(ray + k * 4 + 0x80);
      fVar137 = local_fb8;
      fVar172 = fStack_fb4;
      fVar127 = fStack_fb0;
      fVar109 = fStack_fac;
      fVar74 = local_fc8;
      fVar143 = fStack_fc4;
      fVar158 = fStack_fc0;
      fVar118 = fStack_fbc;
      fVar72 = local_fe8;
      fVar73 = fStack_fe4;
      fVar104 = fStack_fe0;
      fVar98 = fStack_fdc;
      iVar181 = local_1008;
      iVar183 = iStack_1004;
      iVar186 = iStack_1000;
      iVar26 = iStack_ffc;
      iVar90 = iVar76;
      iVar92 = iVar76;
      iVar95 = iVar76;
      fVar170 = local_fa8;
      fVar140 = fStack_fa4;
      fVar177 = fStack_fa0;
      fVar75 = fStack_f9c;
      fVar134 = local_fd8;
      fVar88 = fStack_fd4;
      fVar148 = fStack_fd0;
      fVar89 = fStack_fcc;
      fVar161 = local_ff8;
      fVar86 = fStack_ff4;
      fVar87 = fStack_ff0;
      fVar169 = fStack_fec;
    }
    if (pSVar29 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }